

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

char * luaT_objtypename(lua_State *L,TValue *o)

{
  byte bVar1;
  GCObject *pGVar2;
  TString *key;
  TValue *n;
  TString *pTVar3;
  ushort uVar4;
  char *__assertion;
  size_t sVar5;
  
  uVar4 = o->tt_;
  if (uVar4 < 0x8015) {
    if (uVar4 != 0x8005) {
LAB_0013b8e1:
      if (uVar4 != 0x8007) goto LAB_0013b9f7;
      pTVar3 = (TString *)(o->value_).f;
      if (pTVar3->tt != '\a') {
        __assert_fail("(((o)->value_).gc)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                      ,0x61,"const char *luaT_objtypename(lua_State *, const TValue *)");
      }
      sVar5 = (pTVar3->u).lnglen;
      goto joined_r0x0013b943;
    }
    pTVar3 = (TString *)(o->value_).gc;
    if (pTVar3->tt != '\x05') {
      __assert_fail("(((o)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x60,"const char *luaT_objtypename(lua_State *, const TValue *)");
    }
    sVar5 = pTVar3[1].u.lnglen;
    if (sVar5 == 0) goto LAB_0013b8e1;
  }
  else {
    if ((uVar4 != 0x8015) && (uVar4 != 0x8025)) goto LAB_0013b9f7;
    pGVar2 = (o->value_).gc;
    bVar1 = pGVar2->tt;
    pTVar3 = (TString *)(ulong)bVar1;
    if ((bVar1 != 0x15) && (bVar1 != 0x25)) {
      __assert_fail("((((o)->value_).gc)->tt == ((5) | ((1) << 4)) || (((o)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x62,"const char *luaT_objtypename(lua_State *, const TValue *)");
    }
    sVar5._0_1_ = pGVar2[3].tt;
    sVar5._1_1_ = pGVar2[3].marked;
    sVar5._2_6_ = *(undefined6 *)&pGVar2[3].field_0xa;
joined_r0x0013b943:
    if (sVar5 == 0) goto LAB_0013b9f7;
  }
  key = luaS_new(L,"__name");
  if (key->tt != '\x04') {
    __assert_fail("key->tt == ((4) | ((0) << 4))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                  ,0x5a,"const TValue *luaH_getshortstr(Table *, TString *)");
  }
  n = (TValue *)((ulong)(*(uint *)(sVar5 + 0x38) & key->hash) * 0x20 + *(long *)(sVar5 + 0x18));
  if ((((Node *)n)->i_key).nk.tt_ == 0x8004) {
    pTVar3 = (TString *)(((Node *)n)->i_key).nk.value_.gc;
    if ((pTVar3->tt & 0xf) != 4) {
      __assertion = "(((((k)->value_).gc)->tt) & 0x0F) == 4";
LAB_0013ba5f:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h"
                    ,0x5c,"const TValue *luaH_getshortstr(Table *, TString *)");
    }
    if (pTVar3->tt != 4) {
      __assertion = 
      "((((void) sizeof (((((((((k))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((k))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((k))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((k)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((k)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((k)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.h\", 92, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((k)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
      ;
      goto LAB_0013ba5f;
    }
    if (pTVar3 != key) goto LAB_0013b9b9;
  }
  else {
LAB_0013b9b9:
    if ((((Node *)n)->i_key).nk.next == 0) {
      n = &luaO_nilobject_;
    }
    else {
      n = luaH_getshortstr_continue(key,(Node *)n);
    }
  }
  uVar4 = (((Node *)n)->i_val).tt_ & 0xf;
  if (uVar4 == 4) {
    pGVar2 = (((Node *)n)->i_val).value_.gc;
    if ((pGVar2->tt & 0xf) != 4) {
      __assert_fail("(((((name)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltm.c"
                    ,0x65,"const char *luaT_objtypename(lua_State *, const TValue *)");
    }
    pTVar3 = (TString *)&pGVar2[1].tt;
  }
  if (uVar4 == 4) {
    return (char *)pTVar3;
  }
LAB_0013b9f7:
  return luaT_typenames_[(ulong)(o->tt_ & 0xf) + 1];
}

Assistant:

const char *luaT_objtypename (lua_State *L, const TValue *o) {
  Table *mt;
  if ((ttisLtable(o) && (mt = hvalue(o)->metatable) != NULL) ||
      (ttisfulluserdata(o) && (mt = uvalue(o)->metatable) != NULL) ||
      (ttisarray(o) && (mt = arrvalue(o)->metatable) != NULL)) {
    const TValue *name = luaH_getshortstr(mt, luaS_new(L, "__name"));
    if (ttisstring(name))  /* is '__name' a string? */
      return getstr(tsvalue(name));  /* use it as type name */
  }
  return ttypename(ttnov(o));  /* else use standard type name */
}